

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O3

int Ssw_ClassesRefineOneClass(Ssw_Cla_t *p,Aig_Obj_t *pReprOld,int fRecursive)

{
  uint uVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t **ppAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t **ppAVar6;
  Aig_Obj_t **ppAVar7;
  int iVar8;
  int iVar9;
  void **ppvVar10;
  long lVar11;
  Vec_Ptr_t *pVVar12;
  Aig_Obj_t *pAVar13;
  Vec_Ptr_t *pVVar14;
  long lVar15;
  bool bVar16;
  int *local_48;
  
  pVVar14 = p->vClassNew;
  iVar9 = 0;
  p->vClassOld->nSize = 0;
  pVVar14->nSize = 0;
  lVar15 = (long)pReprOld->Id;
  if (0 < p->pClassSizes[lVar15]) {
    local_48 = &pReprOld->Id;
    bVar16 = fRecursive == 0;
    iVar9 = 0;
    do {
      lVar11 = 0;
      do {
        pAVar3 = p->pId2Class[lVar15][lVar11];
        if (pAVar3 != (Aig_Obj_t *)0x0) {
          iVar8 = (*p->pFuncNodesAreEqual)(p->pManData,pReprOld,pAVar3);
          if (iVar8 == 0) {
            pVVar14 = p->vClassNew;
          }
          else {
            pVVar14 = p->vClassOld;
          }
          uVar1 = pVVar14->nSize;
          if (uVar1 == pVVar14->nCap) {
            if ((int)uVar1 < 0x10) {
              if (pVVar14->pArray == (void **)0x0) {
                ppvVar10 = (void **)malloc(0x80);
              }
              else {
                ppvVar10 = (void **)realloc(pVVar14->pArray,0x80);
              }
              pVVar14->pArray = ppvVar10;
              pVVar14->nCap = 0x10;
            }
            else {
              if (pVVar14->pArray == (void **)0x0) {
                ppvVar10 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar10 = (void **)realloc(pVVar14->pArray,(ulong)uVar1 << 4);
              }
              pVVar14->pArray = ppvVar10;
              pVVar14->nCap = uVar1 * 2;
            }
          }
          else {
            ppvVar10 = pVVar14->pArray;
          }
          iVar8 = pVVar14->nSize;
          pVVar14->nSize = iVar8 + 1;
          ppvVar10[iVar8] = pAVar3;
        }
        lVar11 = lVar11 + 1;
        lVar15 = (long)*local_48;
      } while (lVar11 < p->pClassSizes[lVar15]);
      iVar8 = p->vClassNew->nSize;
      if (iVar8 == 0) {
        iVar8 = 0;
        break;
      }
      if (iVar8 < 1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (p->vClassOld->nSize < 1) {
        __assert_fail("Vec_PtrSize(p->vClassOld) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                      ,0x3e1,"int Ssw_ClassesRefineOneClass(Ssw_Cla_t *, Aig_Obj_t *, int)");
      }
      ppAVar4 = p->pId2Class[lVar15];
      if (ppAVar4 == (Aig_Obj_t **)0x0) {
        __assert_fail("pClass != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                      ,0x77,"Aig_Obj_t **Ssw_ObjRemoveClass(Ssw_Cla_t *, Aig_Obj_t *)");
      }
      pAVar3 = (Aig_Obj_t *)*p->vClassNew->pArray;
      p->pId2Class[lVar15] = (Aig_Obj_t **)0x0;
      iVar8 = p->pClassSizes[lVar15];
      if (iVar8 < 2) {
        __assert_fail("nSize > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                      ,0x7a,"Aig_Obj_t **Ssw_ObjRemoveClass(Ssw_Cla_t *, Aig_Obj_t *)");
      }
      p->nClasses = p->nClasses + -1;
      p->nLits = (p->nLits - iVar8) + 1;
      p->pClassSizes[lVar15] = 0;
      pVVar14 = p->vClassOld;
      if (pVVar14->nSize < 1) {
        lVar15 = 0;
      }
      else {
        lVar15 = 0;
        do {
          pAVar5 = (Aig_Obj_t *)pVVar14->pArray[lVar15];
          ppAVar4[lVar15] = pAVar5;
          ppAVar6 = p->pAig->pReprs;
          if (ppAVar6 == (Aig_Obj_t **)0x0) goto LAB_005e3a54;
          pAVar13 = pReprOld;
          if (lVar15 == 0) {
            pAVar13 = (Aig_Obj_t *)0x0;
          }
          ppAVar6[pAVar5->Id] = pAVar13;
          lVar15 = lVar15 + 1;
          pVVar14 = p->vClassOld;
        } while (lVar15 < pVVar14->nSize);
      }
      ppAVar6 = ppAVar4 + lVar15;
      pVVar12 = p->vClassNew;
      if (0 < pVVar12->nSize) {
        lVar15 = 0;
        do {
          pAVar5 = (Aig_Obj_t *)pVVar12->pArray[lVar15];
          ppAVar6[lVar15] = pAVar5;
          ppAVar7 = p->pAig->pReprs;
          if (ppAVar7 == (Aig_Obj_t **)0x0) {
LAB_005e3a54:
            __assert_fail("p->pReprs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                          ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
          }
          pAVar13 = pAVar3;
          if (lVar15 == 0) {
            pAVar13 = (Aig_Obj_t *)0x0;
          }
          ppAVar7[pAVar5->Id] = pAVar13;
          lVar15 = lVar15 + 1;
          pVVar12 = p->vClassNew;
        } while (lVar15 < pVVar12->nSize);
        pVVar14 = p->vClassOld;
      }
      iVar8 = pVVar14->nSize;
      if (1 < iVar8) {
        iVar2 = *local_48;
        if (p->pId2Class[iVar2] != (Aig_Obj_t **)0x0) goto LAB_005e3aef;
        if (*ppAVar4 != pReprOld) goto LAB_005e3b0e;
        p->pId2Class[iVar2] = ppAVar4;
        if (p->pClassSizes[iVar2] != 0) goto LAB_005e3b2d;
        p->pClassSizes[iVar2] = iVar8;
        p->nClasses = p->nClasses + 1;
        p->nLits = p->nLits + iVar8 + -1;
        pVVar12 = p->vClassNew;
      }
      iVar8 = pVVar12->nSize;
      if (1 < iVar8) {
        iVar2 = pAVar3->Id;
        if (p->pId2Class[iVar2] != (Aig_Obj_t **)0x0) {
LAB_005e3aef:
          __assert_fail("p->pId2Class[pRepr->Id] == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                        ,0x5e,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
        }
        if (*ppAVar6 != pAVar3) {
LAB_005e3b0e:
          __assert_fail("pClass[0] == pRepr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                        ,0x5f,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
        }
        p->pId2Class[iVar2] = ppAVar6;
        if (p->pClassSizes[iVar2] != 0) {
LAB_005e3b2d:
          __assert_fail("p->pClassSizes[pRepr->Id] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                        ,0x61,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
        }
        p->pClassSizes[iVar2] = iVar8;
        p->nClasses = p->nClasses + 1;
        p->nLits = iVar8 + p->nLits + -1;
      }
      if ((bVar16) || (pVVar14 = p->vClassNew, pVVar14->nSize < 2)) {
        iVar8 = 1;
        break;
      }
      iVar9 = iVar9 + 1;
      bVar16 = false;
      iVar8 = 0;
      p->vClassOld->nSize = 0;
      pVVar14->nSize = 0;
      local_48 = &pAVar3->Id;
      lVar15 = (long)pAVar3->Id;
      pReprOld = pAVar3;
    } while (0 < p->pClassSizes[lVar15]);
    iVar9 = iVar9 + iVar8;
  }
  return iVar9;
}

Assistant:

int Ssw_ClassesRefineOneClass( Ssw_Cla_t * p, Aig_Obj_t * pReprOld, int fRecursive )
{
    Aig_Obj_t ** pClassOld, ** pClassNew;
    Aig_Obj_t * pObj, * pReprNew;
    int i;

    // split the class
    Vec_PtrClear( p->vClassOld );
    Vec_PtrClear( p->vClassNew );
    Ssw_ClassForEachNode( p, pReprOld, pObj, i )
        if ( p->pFuncNodesAreEqual(p->pManData, pReprOld, pObj) )
            Vec_PtrPush( p->vClassOld, pObj );
        else
            Vec_PtrPush( p->vClassNew, pObj );
    // check if splitting happened
    if ( Vec_PtrSize(p->vClassNew) == 0 )
        return 0;
    // remember that this class is refined
//    Ssw_ClassForEachNode( p, pReprOld, pObj, i )
//        Vec_PtrPush( p->vRefined, pObj );

    // get the new representative
    pReprNew = (Aig_Obj_t *)Vec_PtrEntry( p->vClassNew, 0 );
    assert( Vec_PtrSize(p->vClassOld) > 0 );
    assert( Vec_PtrSize(p->vClassNew) > 0 );

    // create old class
    pClassOld = Ssw_ObjRemoveClass( p, pReprOld );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassOld, pObj, i )
    {
        pClassOld[i] = pObj;
        Aig_ObjSetRepr( p->pAig, pObj, i? pReprOld : NULL );
    }
    // create new class
    pClassNew = pClassOld + i;
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
    {
        pClassNew[i] = pObj;
        Aig_ObjSetRepr( p->pAig, pObj, i? pReprNew : NULL );
    }

    // put classes back
    if ( Vec_PtrSize(p->vClassOld) > 1 )
        Ssw_ObjAddClass( p, pReprOld, pClassOld, Vec_PtrSize(p->vClassOld) );
    if ( Vec_PtrSize(p->vClassNew) > 1 )
        Ssw_ObjAddClass( p, pReprNew, pClassNew, Vec_PtrSize(p->vClassNew) );

    // check if the class should be recursively refined
    if ( fRecursive && Vec_PtrSize(p->vClassNew) > 1 )
        return 1 + Ssw_ClassesRefineOneClass( p, pReprNew, 1 );
    return 1;
}